

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

void sysbvm_heap_destroy(sysbvm_heap_t *heap)

{
  sysbvm_heap_mallocObjectHeader_s *psVar1;
  sysbvm_heap_mallocObjectHeader_t *__ptr;
  
  __ptr = heap->firstMallocObject;
  while (__ptr != (sysbvm_heap_mallocObjectHeader_t *)0x0) {
    psVar1 = (__ptr->field_0).field_0.next;
    free(__ptr);
    __ptr = psVar1;
  }
  sysbvm_chunkedAllocator_destroy(&heap->gcRootTableAllocator);
  sysbvm_chunkedAllocator_destroy(&heap->picTableAllocator);
  sysbvm_chunkedAllocator_destroy(&heap->codeAllocator);
  return;
}

Assistant:

void sysbvm_heap_destroy(sysbvm_heap_t *heap)
{
    {
        sysbvm_heap_mallocObjectHeader_t *position = heap->firstMallocObject;
        while(position)
        {
            sysbvm_heap_mallocObjectHeader_t *objectToFree = position;
            position = position->next;
            free(objectToFree);
        }
    }

    sysbvm_chunkedAllocator_destroy(&heap->gcRootTableAllocator);
    sysbvm_chunkedAllocator_destroy(&heap->picTableAllocator);
    sysbvm_chunkedAllocator_destroy(&heap->codeAllocator);
}